

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

bool __thiscall DListBase<JumpCleanupInfo,_RealCount>::Iterator::Prev(Iterator *this)

{
  DListBase<JumpCleanupInfo,_RealCount> *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  NodeBase *pNVar5;
  DListBase<JumpCleanupInfo,_RealCount> *pDVar6;
  
  pNVar5 = this->current;
  if (pNVar5 == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x72,"(current != nullptr)","current != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pNVar5 = this->current;
  }
  pDVar1 = (DListBase<JumpCleanupInfo,_RealCount> *)(pNVar5->prev).base;
  bVar3 = pDVar1 != this->list;
  pDVar6 = (DListBase<JumpCleanupInfo,_RealCount> *)0x0;
  if (bVar3) {
    pDVar6 = pDVar1;
  }
  this->current = &pDVar6->super_DListNodeBase<JumpCleanupInfo>;
  return bVar3;
}

Assistant:

bool Prev()
        {
            Assert(current != nullptr);
            if (list->IsHead(current->Prev()))
            {
                current = nullptr;
                return false;
            }
            current = current->Prev();
            return true;
        }